

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuspendingcall.cpp
# Opt level: O3

QDBusMessage __thiscall QDBusPendingCall::reply(QDBusPendingCall *this)

{
  __base_type _Var1;
  QDBusPendingCallPrivate *pQVar2;
  QDBusPendingCall *in_RSI;
  QMutex *pQVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QDBusError QStack_98;
  QString local_58;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (in_RSI->d).d.ptr;
  if (pQVar2 == (QDBusPendingCallPrivate *)0x0) {
    error(&QStack_98,in_RSI);
    QDBusError::name(&QStack_98);
    QDBusError::message(&QStack_98);
    QDBusMessage::createError((QDBusMessage *)this,&local_40,&local_58);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(QStack_98.nm.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_98.nm.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_98.nm.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_98.nm.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(QStack_98.nm.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(QStack_98.msg.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_98.msg.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_98.msg.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_98.msg.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(QStack_98.msg.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    pQVar3 = &pQVar2->mutex;
    if ((pQVar2->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
      LOCK();
      bVar4 = (pQVar3->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
      if (bVar4) {
        (pQVar3->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
      }
      UNLOCK();
      if (!bVar4) goto LAB_0018697a;
    }
    else {
LAB_0018697a:
      QBasicMutex::lockInternal();
    }
    QDBusMessage::QDBusMessage((QDBusMessage *)this,&((in_RSI->d).d.ptr)->replyMessage);
    LOCK();
    _Var1._M_p = (pQVar3->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
    (pQVar3->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if (_Var1._M_p != (__pointer_type)0x1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        QBasicMutex::unlockInternalFutex(pQVar3);
        return (QDBusMessage)this;
      }
      goto LAB_00186aa7;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDBusMessage)(QDBusMessagePrivate *)this;
  }
LAB_00186aa7:
  __stack_chk_fail();
}

Assistant:

QDBusMessage QDBusPendingCall::reply() const
{
    if (!d)
        return QDBusMessage::createError(error());
    const auto locker = qt_scoped_lock(d->mutex);
    return d->replyMessage;
}